

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.h
# Opt level: O3

Rect __thiscall
lunasvg::SVGPreserveAspectRatio::getClipRect
          (SVGPreserveAspectRatio *this,Rect *viewBoxRect,Size *viewportSize)

{
  undefined4 uVar1;
  undefined4 uVar3;
  Size SVar2;
  uint uVar4;
  float fVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar13;
  float fVar14;
  Rect RVar15;
  undefined8 uVar6;
  
  uVar1 = viewBoxRect->w;
  uVar3 = viewBoxRect->h;
  auVar8._4_4_ = uVar3;
  auVar8._0_4_ = uVar1;
  if (((float)uVar1 <= 0.0) || ((float)uVar3 <= 0.0)) {
LAB_001200b9:
    __assert_fail("!viewBoxRect.isEmpty() && !viewportSize.isEmpty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgproperty.cpp"
                  ,0x20d,
                  "Rect lunasvg::SVGPreserveAspectRatio::getClipRect(const Rect &, const Size &) const"
                 );
  }
  SVar2 = *viewportSize;
  auVar9._8_8_ = 0;
  auVar9._0_4_ = SVar2.w;
  auVar9._4_4_ = SVar2.h;
  fVar14 = SVar2.w;
  if ((fVar14 <= 0.0) || (fVar13 = SVar2.h, fVar13 <= 0.0)) goto LAB_001200b9;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = SVar2.w;
  auVar10._4_4_ = SVar2.h;
  auVar8._8_8_ = 0;
  auVar11 = divps(auVar10,auVar8);
  uVar4 = *(uint *)&(this->super_SVGProperty).field_0xc;
  if (uVar4 == 0) {
    uVar6._0_4_ = viewBoxRect->x;
    uVar6._4_4_ = viewBoxRect->y;
    goto LAB_001200b5;
  }
  fVar5 = auVar11._0_4_;
  fVar12 = auVar11._4_4_;
  if (this->m_meetOrSlice == Meet) {
    if (fVar5 <= fVar12) {
      fVar12 = fVar5;
    }
  }
  else if (fVar12 <= fVar5) {
    fVar12 = fVar5;
  }
  fVar5 = -viewBoxRect->x * fVar12;
  if (uVar4 < 10) {
    if ((0x124U >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0x248U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_00120076;
      fVar14 = fVar14 - (float)uVar1 * fVar12;
    }
    else {
      fVar14 = (fVar14 - (float)uVar1 * fVar12) * 0.5;
    }
    fVar5 = fVar5 + fVar14;
  }
LAB_00120076:
  fVar14 = -viewBoxRect->y * fVar12;
  if (uVar4 - 7 < 3) {
    fVar13 = fVar13 - (float)uVar3 * fVar12;
LAB_001200a0:
    fVar14 = fVar14 + fVar13;
  }
  else if (uVar4 - 4 < 3) {
    fVar13 = (fVar13 - (float)uVar3 * fVar12) * 0.5;
    goto LAB_001200a0;
  }
  auVar7._0_8_ = CONCAT44(fVar14,fVar5) ^ 0x8000000080000000;
  auVar7._8_8_ = 0;
  auVar11._4_4_ = fVar12;
  auVar11._0_4_ = fVar12;
  auVar11._8_4_ = fVar12;
  auVar11._12_4_ = fVar12;
  auVar8 = divps(auVar7,auVar11);
  uVar6 = auVar8._0_8_;
LAB_001200b5:
  auVar8 = divps(auVar9,auVar11);
  RVar15._8_8_ = auVar8._0_8_;
  RVar15.x = (float)(int)uVar6;
  RVar15.y = (float)(int)((ulong)uVar6 >> 0x20);
  return RVar15;
}

Assistant:

constexpr bool isEmpty() const { return w <= 0.f || h <= 0.f; }